

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

Gia_Man_t * Mf_ManDeriveMapping(Mf_Man_t *p)

{
  Jf_Par_t *pJVar1;
  Gia_Man_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  ulong uVar4;
  int v;
  long lVar5;
  
  pJVar1 = p->pPars;
  if ((pJVar1->fCutMin != 0) || (p->pGia->vMapping != (Vec_Int_t *)0x0)) {
    __assert_fail("!p->pPars->fCutMin && p->pGia->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                  ,0x495,"Gia_Man_t *Mf_ManDeriveMapping(Mf_Man_t *)");
  }
  p_01 = Vec_IntAlloc(p->pGia->nObjs + (int)pJVar1->Edge + (int)pJVar1->Area * 2);
  Vec_IntFill(p_01,p->pGia->nObjs,0);
  for (lVar5 = 0; p_00 = p->pGia, lVar5 < p_00->nObjs; lVar5 = lVar5 + 1) {
    v = (int)lVar5;
    pGVar2 = Gia_ManObj(p_00,v);
    if (((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) &&
       (0xffff < *(uint *)&p->pLfObjs[lVar5].field_0xc)) {
      piVar3 = Mf_ObjCutSet(p,v);
      Vec_IntWriteEntry(p_01,v,p_01->nSize);
      Vec_IntPush(p_01,piVar3[1] & 0x1f);
      for (uVar4 = 1; uVar4 <= (piVar3[1] & 0x1f); uVar4 = uVar4 + 1) {
        Vec_IntPush(p_01,piVar3[uVar4 + 1]);
      }
      Vec_IntPush(p_01,v);
    }
  }
  if ((p_01->nCap != 0x10) && (p_01->nSize != p_01->nCap)) {
    __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                  ,0x4a3,"Gia_Man_t *Mf_ManDeriveMapping(Mf_Man_t *)");
  }
  p_00->vMapping = p_01;
  return p_00;
}

Assistant:

Gia_Man_t * Mf_ManDeriveMapping( Mf_Man_t * p )
{
    Vec_Int_t * vMapping;
    int i, k, * pCut;
    assert( !p->pPars->fCutMin && p->pGia->vMapping == NULL );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, Mf_CutSize(pCut) );
        for ( k = 1; k <= Mf_CutSize(pCut); k++ )
            Vec_IntPush( vMapping, pCut[k] );
        Vec_IntPush( vMapping, i );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
    return p->pGia;
}